

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

wchar_t rd_monster_memory(void)

{
  bitflag *pbVar1;
  _Bool _Var2;
  wchar_t wVar3;
  char *message;
  monster_race *pmVar4;
  long lVar5;
  ulong uVar6;
  uint16_t nkill;
  uint16_t ntheft;
  char buf [128];
  uint16_t local_bc;
  uint16_t local_ba;
  long local_b8;
  long local_b0;
  char local_a8;
  
  rd_byte(&mflag_size);
  if (mflag_size < 3) {
    if (z_info != (angband_constants *)0x0) {
      lVar5 = 300;
      uVar6 = 0;
      do {
        pmVar4 = r_info;
        uVar6 = uVar6 + 1;
        if (z_info->r_max <= uVar6) break;
        pbVar1 = r_info->flags;
        r_info->flags[lVar5 + -0x28] = 'd';
        _Var2 = flag_has_dbg(pbVar1 + lVar5 + -0x5c,0xc,1,"race->flags","RF_UNIQUE");
        if (_Var2) {
          pmVar4->flags[lVar5 + -0x28] = '\x01';
        }
        lVar5 = lVar5 + 0xd0;
      } while (z_info != (angband_constants *)0x0);
    }
    rd_string((char *)&local_b8,0x80);
    wVar3 = L'\0';
    if ((local_a8 != '\0' || local_b8 != 0x2065726f6d206f4e) || local_b0 != 0x73726574736e6f6d) {
      do {
        pmVar4 = lookup_monster((char *)&local_b8);
        rd_u16b(&local_bc);
        rd_u16b(&local_ba);
        if (pmVar4 != (monster_race *)0x0) {
          l_list[pmVar4->ridx].pkills = local_bc;
          _Var2 = flag_has_dbg(pmVar4->flags,0xc,1,"race->flags","RF_UNIQUE");
          if ((_Var2) && (local_bc != 0)) {
            pmVar4->max_num = '\0';
          }
          l_list[pmVar4->ridx].thefts = local_ba;
          rd_string((char *)&local_b8,0x80);
        }
      } while ((local_a8 != '\0' || local_b8 != 0x2065726f6d206f4e) ||
               local_b0 != 0x73726574736e6f6d);
      wVar3 = L'\0';
    }
  }
  else {
    message = format("Too many (%u) monster temporary flags!");
    note(message);
    wVar3 = L'\xffffffff';
  }
  return wVar3;
}

Assistant:

int rd_monster_memory(void)
{
	uint16_t nkill, ntheft;
	char buf[128];
	int i;

	/* Monster temporary flags */
	rd_byte(&mflag_size);

	/* Incompatible save files */
	if (mflag_size > MFLAG_SIZE) {
	        note(format("Too many (%u) monster temporary flags!", mflag_size));
		return (-1);
	}

	/* Reset maximum numbers per level */
	for (i = 1; z_info && i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		race->max_num = 100;
		if (rf_has(race->flags, RF_UNIQUE))
			race->max_num = 1;
	}

	rd_string(buf, sizeof(buf));
	while (!streq(buf, "No more monsters")) {
		struct monster_race *race = lookup_monster(buf);

		/* Get the kill and theft counts, skip if monster invalid */
		rd_u16b(&nkill);
		rd_u16b(&ntheft);
		if (!race) continue;

		/* Store the kill count, ensure dead uniques stay dead */
		l_list[race->ridx].pkills = nkill;
		if (rf_has(race->flags, RF_UNIQUE) && nkill)
			race->max_num = 0;

		/* Store the theft count */
		l_list[race->ridx].thefts = ntheft;

		/* Look for the next monster */
		rd_string(buf, sizeof(buf));
	}

	return 0;
}